

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O2

void __thiscall
mp::NLW2_NLFeeder_C_Impl::
FeedSuffixes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLW2_NLFeeder_C_Impl>>::SuffixWriterFactory>
          (NLW2_NLFeeder_C_Impl *this,SuffixWriterFactory *swf)

{
  NLW2_SuffixWriter_C sw_c;
  SuffixDblWriter dbl_writer;
  SuffixIntWriter int_writer;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  anon_class_24_3_766800c0 local_90;
  _Any_data local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  SuffixIntWriter local_38;
  SuffixIntWriter local_28;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_b0._M_unused._M_object = &local_28;
  local_28.p_nlw_ =
       (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)0x0;
  local_28.n_entries_ = 0;
  local_38.p_nlw_ =
       (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *)0x0;
  local_38.n_entries_ = 0;
  local_90.dbl_write_fn = (function<void_(int,_double)> *)&local_b0;
  local_b0._8_8_ = 0;
  local_98 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:885:9)>
             ::_M_invoke;
  local_a0 = std::
             _Function_handler<void_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:885:9)>
             ::_M_manager;
  local_d0._8_8_ = 0;
  local_b8 = std::
             _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:887:9)>
             ::_M_invoke;
  local_c0 = std::
             _Function_handler<void_(int,_double),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/nl-writer2/src/nl-solver-c.cc:887:9)>
             ::_M_manager;
  local_d0._M_unused._M_object = &local_38;
  local_90.swf = swf;
  local_90.dbl_writer = (SuffixDblWriter *)local_b0._M_unused._0_8_;
  std::function<void*(char_const*,int,int)>::operator=
            ((function<void*(char_const*,int,int)> *)local_78._M_pod_data,
             (anon_class_24_3_37f068e0 *)&local_90);
  local_90.dbl_write_fn = (function<void_(int,_double)> *)&local_d0;
  local_90.swf = swf;
  local_90.dbl_writer = (SuffixDblWriter *)&local_38;
  std::function<void*(char_const*,int,int)>::operator=
            ((function<void*(char_const*,int,int)> *)local_58._M_pod_data,&local_90);
  (*(this->nlf2_c_).FeedSuffixes)((this->nlf2_c_).p_user_data_,&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_b0);
  NLW2_SuffixWriter_C::~NLW2_SuffixWriter_C((NLW2_SuffixWriter_C *)&local_78);
  return;
}

Assistant:

void mp::NLW2_NLFeeder_C_Impl::FeedSuffixes(SuffixWriterFactory& swf) {
  NLW2_SuffixWriter_C sw_c;
  decltype( swf.StartIntSuffix(nullptr, 0, 0) ) int_writer;
  decltype( swf.StartDblSuffix(nullptr, 0, 0) ) dbl_writer;
  // These would write sparse entries
  std::function<void(int, int)> int_write_fn
      = [&int_writer](int i, int v) { int_writer.Write(i, v); };
  std::function<void(int, double)> dbl_write_fn
      = [&dbl_writer](int i, double v) { dbl_writer.Write(i, v); };
  // There would start a suffix
  sw_c.int_suf_starter_ = [&swf, &int_writer, &int_write_fn]
      (const char* suf_name, int kind, int nnz) {
    int_writer = swf.StartIntSuffix(suf_name, kind, nnz);
    return (void*)(&int_write_fn);
  };
  sw_c.dbl_suf_starter_ = [&swf, &dbl_writer, &dbl_write_fn]
      (const char* suf_name, int kind, int nnz) {
    dbl_writer = swf.StartDblSuffix(suf_name, kind, nnz);
    return (void*)(&dbl_write_fn);
  };
  assert(NLF().FeedSuffixes);
  NLF().FeedSuffixes(NLF().p_user_data_, &sw_c);
}